

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O1

int conn_listen(conn_handle *conn)

{
  int iVar1;
  int *piVar2;
  char *__service;
  addrinfo *res;
  addrinfo *local_50;
  addrinfo local_48;
  
  local_50 = (addrinfo *)0x0;
  piVar2 = (int *)conn->priv;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  if (conn->type == CONN_TYPE_TCP) {
    local_48.ai_socktype = 1;
  }
  else {
    if (conn->type != CONN_TYPE_UDP) {
      return -1;
    }
    local_48.ai_socktype = 2;
  }
  local_48.ai_protocol = 0;
  local_48.ai_flags = 1;
  local_48.ai_family = 0;
  __service = "0";
  if (conn->source_port != (char *)0x0) {
    __service = conn->source_port;
  }
  iVar1 = getaddrinfo(conn->source_addr,__service,&local_48,&local_50);
  if (iVar1 == 0) {
    iVar1 = socket(local_50->ai_family,local_50->ai_socktype,local_50->ai_protocol);
    *piVar2 = iVar1;
    if (((iVar1 == -1) || (iVar1 = setsockopt(iVar1,1,2,&conn_listen::yes,4), iVar1 == -1)) ||
       (iVar1 = bind(*piVar2,local_50->ai_addr,local_50->ai_addrlen), iVar1 == -1)) {
      piVar2 = __errno_location();
      iVar1 = -*piVar2;
    }
    else if ((conn->type == CONN_TYPE_TCP) && (iVar1 = listen(*piVar2,0), iVar1 == -1)) {
      piVar2 = __errno_location();
      iVar1 = -*piVar2;
    }
    else {
      mutex_lock((mutex_handle *)(piVar2 + 0x24));
      piVar2[2] = *piVar2;
      mutex_unlock((mutex_handle *)(piVar2 + 0x24));
    }
    freeaddrinfo(local_50);
    return iVar1;
  }
  return -99;
}

Assistant:

int conn_listen(struct conn_handle *conn)
{
	struct addrinfo hints;
	struct addrinfo *res = NULL;
	struct conn_priv *priv = conn->priv;
	int ret;
	static const int yes = 1;

	memset(&hints, 0x0, sizeof(hints));

	switch (conn->type) {
	case CONN_TYPE_TCP:
		hints.ai_socktype = SOCK_STREAM;
		break;
	case  CONN_TYPE_UDP:
		hints.ai_socktype = SOCK_DGRAM;
		break;
	default:
		return -1;
	}

	hints.ai_family = AF_UNSPEC;
	hints.ai_flags = AI_PASSIVE;

	ret = getaddrinfo(conn->source_addr,
			  conn->source_port == NULL ? "0" : conn->source_port,
			  &hints, &res);
	if (ret != 0)
		return -EADDRNOTAVAIL;

	priv->sock_fd = socket(res->ai_family, res->ai_socktype,
			       res->ai_protocol);
	if (priv->sock_fd == INVALID_SOCKET) {
		ret = SOCK_ERRNO;
		goto conn_listen_free;
	}

	ret = setsockopt(priv->sock_fd, SOL_SOCKET, SO_REUSEADDR,
			 (const void *)&yes, sizeof(yes));
	if (ret == SOCKET_ERROR) {
		/*! @TODO Close priv->sock_fd */
		ret = SOCK_ERRNO;
		goto conn_listen_free;
	}

#ifdef __APPLE__
	ret = setsockopt(priv->sock_fd, SOL_SOCKET, SO_NOSIGPIPE,
			 (const void *)&yes, sizeof(yes));
	if (ret == SOCKET_ERROR) {
		/*! @TODO Close priv->sock_fd */
		ret = SOCK_ERRNO;
		goto conn_listen_free;
	}
#endif

	ret = bind(priv->sock_fd, res->ai_addr, (socklen_t)res->ai_addrlen);
	if (ret == SOCKET_ERROR) {
		/*! @TODO Close priv->sock_fd */
		ret = SOCK_ERRNO;
		goto conn_listen_free;
	}

	if (conn->type == CONN_TYPE_TCP) {
		ret = listen(priv->sock_fd, 0);
		if (ret == SOCKET_ERROR) {
			/*! @TODO Close priv->sock_fd */
			ret = SOCK_ERRNO;
			goto conn_listen_free;
		}
	}

	mutex_lock(&priv->mutex);

	priv->fd = priv->sock_fd;

	mutex_unlock(&priv->mutex);

conn_listen_free:
	freeaddrinfo(res);

	return ret;
}